

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O1

int rpm_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ssize_t avail;
  ssize_t sStack_8;
  
  piVar3 = (int *)__archive_read_filter_ahead(filter,8,&sStack_8);
  iVar1 = 0;
  iVar2 = 0;
  if ((((piVar3 != (int *)0x0) && (iVar2 = iVar1, *piVar3 == -0x24115413)) &&
      ((byte)((char)piVar3[1] - 3U) < 2)) &&
     ((*(char *)((long)piVar3 + 6) == '\0' && (iVar2 = 0x38, 1 < *(byte *)((long)piVar3 + 7))))) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
rpm_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 8, &avail);
	if (b == NULL)
		return (0);

	bits_checked = 0;
	/*
	 * Verify Header Magic Bytes : 0XED 0XAB 0XEE 0XDB
	 */
	if (memcmp(b, "\xED\xAB\xEE\xDB", 4) != 0)
		return (0);
	bits_checked += 32;
	/*
	 * Check major version.
	 */
	if (b[4] != 3 && b[4] != 4)
		return (0);
	bits_checked += 8;
	/*
	 * Check package type; binary or source.
	 */
	if (b[6] != 0)
		return (0);
	bits_checked += 8;
	if (b[7] != 0 && b[7] != 1)
		return (0);
	bits_checked += 8;

	return (bits_checked);
}